

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.h
# Opt level: O0

ostream * ninx::lexer::token::operator<<(ostream *strm,Token *a)

{
  ostream *poVar1;
  string local_38 [32];
  Token *local_18;
  Token *a_local;
  ostream *strm_local;
  
  local_18 = a;
  a_local = (Token *)strm;
  (*a->_vptr_Token[3])();
  poVar1 = std::operator<<(strm,local_38);
  std::__cxx11::string::~string(local_38);
  return poVar1;
}

Assistant:

std::ostream& operator<<(std::ostream &strm, const Token &a) {
                    return strm << a.dump();
                }